

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_long>
          (TryCast *this,string_t input,uint64_t *result,bool strict)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  idx_t pos;
  ulong *puVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  ulong *puVar10;
  char *pcVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  char cVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  IntegerCastData<short> local_76;
  undefined4 local_74;
  undefined8 local_70;
  IntegerDecimalCastData<unsigned_long> local_68;
  ulong *local_50;
  ulong local_48;
  string_t input_local;
  
  puVar10 = input.value._8_8_;
  pcVar11 = input.value._0_8_;
  uVar6 = SUB84(result,0);
  input_local.value.pointer.ptr = pcVar11;
  pcVar15 = pcVar11;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  uVar16 = (ulong)this & 0xffffffff;
  local_74._0_1_ = (byte)result;
  if (uVar16 != 0) {
    iVar7 = 3;
    uVar13 = 0;
    do {
      bVar3 = pcVar15[uVar13];
      uVar18 = (uint)bVar3;
      if ((4 < uVar18 - 9) && (uVar18 != 0x20)) {
        if (uVar18 == 0x2d) {
          uVar21 = uVar16 - uVar13;
          uVar14 = 1;
          goto LAB_00ce3966;
        }
        if (bVar3 == 0x30 && uVar16 - 1 != uVar13) {
          cVar17 = pcVar15[uVar13 + 1];
          if (cVar17 != 'B') {
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_00ce3d1d;
              if (cVar17 != 'X') {
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_00ce3ea1;
                goto LAB_00ce3eb0;
              }
            }
            pcVar11 = (char *)0x0;
            uVar14 = 1;
            goto LAB_00ce3a22;
          }
LAB_00ce3d1d:
          uVar14 = ~uVar13 + uVar16;
          bVar25 = 1 < uVar14;
          if (!bVar25) {
            pcVar11 = (char *)0x0;
            goto LAB_00ce3983;
          }
          pcVar11 = (char *)0x0;
          uVar21 = 1;
          goto LAB_00ce3d36;
        }
LAB_00ce3ea1:
        if (((byte)local_74 & bVar3 == 0x2b) != 0) goto LAB_00ce3eb0;
        local_70 = (ulong *)(uVar16 - uVar13);
        local_50 = (ulong *)(ulong)(bVar3 == 0x2b);
        pcVar11 = (char *)0x0;
        puVar5 = local_50;
        goto LAB_00ce3ece;
      }
      uVar13 = uVar13 + 1;
    } while (uVar16 != uVar13);
  }
  bVar25 = false;
  goto LAB_00ce3983;
  while (lVar2 = uVar13 + uVar14, uVar14 = uVar14 + 1, pcVar15[lVar2] == '0') {
LAB_00ce3966:
    if (uVar21 <= uVar14) {
      uVar14 = 1;
      pcVar11 = (char *)0x0;
      goto LAB_00ce3b5f;
    }
  }
LAB_00ce3eb0:
  pcVar11 = (char *)0x0;
LAB_00ce3eb2:
  bVar25 = false;
  goto LAB_00ce3983;
  while( true ) {
    bVar4 = true;
    uVar20 = uVar14 + 1;
    if ((~uVar14 + uVar16 != uVar13) && (pcVar15[uVar13 + 1 + uVar14] == '_' && (byte)local_74 == 0)
       ) {
      uVar20 = uVar14 + 2;
      if ((uVar16 - uVar14) - 2 == uVar13) {
        bVar4 = false;
      }
      else {
        bVar4 = (byte)(pcVar15[uVar13 + uVar20] - 0x30U) < 10;
      }
    }
    uVar14 = uVar20;
    pcVar11 = (char *)((long)pcVar11 * 10 - (ulong)bVar3);
    bVar25 = false;
    if (!bVar4) break;
LAB_00ce3b5f:
    if (uVar21 <= uVar14) goto LAB_00ce3daf;
    bVar3 = pcVar15[uVar13 + uVar14] - 0x30;
    if (9 < bVar3) {
      if (pcVar15[uVar13 + uVar14] == '.') {
        if ((byte)local_74 != 0) goto LAB_00ce3eb2;
        uVar20 = uVar14 + 1;
        if (uVar20 < uVar21) {
          iVar7 = 0;
          if (9 < (byte)(pcVar15[uVar13 + 1 + uVar14] - 0x30U)) goto LAB_00ce447d;
          iVar8 = 1;
        }
        else {
          iVar7 = 3;
LAB_00ce447d:
          iVar8 = 1;
          if (1 < uVar14) {
            iVar8 = iVar7;
          }
        }
        uVar14 = uVar20;
        if (iVar8 == 3) goto LAB_00ce3daf;
        if (iVar8 != 0) goto LAB_00ce3eb2;
      }
      bVar25 = false;
      if (((ulong)(byte)pcVar15[uVar13 + uVar14] < 0x21) &&
         (bVar25 = false, (0x100003e00U >> ((ulong)(byte)pcVar15[uVar13 + uVar14] & 0x3f) & 1) != 0)
         ) {
        uVar20 = uVar14 + 1;
        uVar14 = uVar20;
        if (uVar21 <= uVar20) goto LAB_00ce3daf;
        goto LAB_00ce4013;
      }
      break;
    }
  }
  goto LAB_00ce3983;
  while (uVar20 = uVar20 + 1, uVar14 = uVar21, uVar21 != uVar20) {
LAB_00ce4013:
    if ((0x20 < (ulong)(byte)pcVar15[uVar13 + uVar20]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar13 + uVar20] & 0x3f) & 1) == 0))
    goto LAB_00ce3eb2;
  }
LAB_00ce3daf:
  bVar25 = 1 < uVar14;
  goto LAB_00ce3983;
LAB_00ce3a22:
  do {
    if (~uVar13 + uVar16 <= uVar14) goto LAB_00ce3daf;
    bVar3 = pcVar15[uVar13 + 1 + uVar14];
    bVar9 = bVar3 | 0x20;
    if (0x19 < (byte)(bVar3 + 0xbf)) {
      bVar9 = bVar3;
    }
    if (9 < (byte)(bVar9 - 0x30)) {
      bVar25 = false;
      if ((0x25 < bVar9 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar9 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar17 = -0x57;
    if ((char)bVar9 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar13) || (pcVar15[uVar13 + 2 + uVar14] != '_')) {
LAB_00ce3add:
      bVar4 = pcVar11 <= (undefined1 *)(~(ulong)(byte)(cVar17 + bVar9) >> 4);
      if (bVar4) {
        pcVar11 = (char *)((long)pcVar11 * 0x10 + (ulong)(byte)(cVar17 + bVar9));
      }
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar13) {
        if (9 < (byte)(pcVar15[uVar13 + 3 + uVar14] - 0x30U)) {
          bVar4 = false;
          uVar18 = (byte)pcVar15[uVar13 + 3 + uVar14] - 0x41;
          if ((0x25 < uVar18) || ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0))
          goto LAB_00ce3b03;
        }
        goto LAB_00ce3add;
      }
      bVar4 = false;
    }
LAB_00ce3b03:
    bVar25 = false;
    uVar14 = uVar21;
  } while (bVar4);
  goto LAB_00ce3983;
  while( true ) {
    uVar24 = uVar21 + 1;
    if (((uVar16 - uVar21) - 2 != uVar13) && (pcVar15[uVar13 + 2 + uVar21] == '_')) {
      if (((uVar16 - uVar21) - 3 == uVar13) || ((pcVar15[uVar13 + 3 + uVar21] & 0xfeU) != 0x30))
      goto LAB_00ce3eb2;
      uVar24 = uVar21 + 2;
    }
    uVar21 = uVar24;
    if ((long)pcVar11 < 0) goto LAB_00ce3eb2;
    pcVar11 = (char *)(uVar20 + (long)pcVar11 * 2);
    bVar25 = true;
    if (uVar14 <= uVar21) break;
LAB_00ce3d36:
    bVar25 = false;
    uVar20 = 0;
    if ((pcVar15[uVar13 + 1 + uVar21] != '0') && (uVar20 = 1, pcVar15[uVar13 + 1 + uVar21] != '1'))
    break;
  }
  goto LAB_00ce3983;
  while( true ) {
    puVar22 = (ulong *)((long)puVar5 + 1);
    bVar4 = false;
    if (pcVar11 <= (undefined1 *)(~(ulong)bVar3 / 10)) {
      pcVar11 = (char *)((long)pcVar11 * 10 + (ulong)bVar3);
      bVar4 = true;
      if ((~(ulong)puVar5 + uVar16 != uVar13) && (pcVar1[uVar13 + 1] == '_' && (byte)local_74 == 0))
      {
        puVar22 = (ulong *)((long)puVar5 + 2);
        if ((uVar16 - (long)puVar5) - 2 == uVar13) {
          bVar4 = false;
        }
        else {
          bVar4 = (byte)((pcVar15 + (long)puVar22)[uVar13] - 0x30U) < 10;
        }
      }
    }
    bVar25 = false;
    puVar5 = puVar22;
    if (!bVar4) break;
LAB_00ce3ece:
    if (local_70 <= puVar5) goto LAB_00ce3f99;
    pcVar1 = (char *)((long)puVar5 + (long)pcVar15);
    bVar3 = pcVar1[uVar13] - 0x30;
    if (9 < bVar3) {
      if (pcVar1[uVar13] == '.') {
        if ((byte)local_74 != 0) goto LAB_00ce3eb2;
        puVar22 = (ulong *)((long)puVar5 + 1);
        if ((puVar22 < local_70) && (iVar7 = 0, (byte)(pcVar1[uVar13 + 1] - 0x30U) < 10)) {
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
          if (local_50 < puVar5) {
            iVar8 = iVar7;
          }
        }
        puVar5 = puVar22;
        if (iVar8 == 3) goto LAB_00ce3f99;
        if (iVar8 != 0) goto LAB_00ce3eb2;
      }
      bVar25 = false;
      if (((ulong)(byte)(pcVar15 + (long)puVar5)[uVar13] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)(pcVar15 + (long)puVar5)[uVar13] & 0x3f) & 1) != 0)) {
        puVar22 = (ulong *)((long)puVar5 + 1);
        puVar5 = puVar22;
        if (local_70 <= puVar22) goto LAB_00ce3f99;
        goto LAB_00ce4215;
      }
      break;
    }
  }
  goto LAB_00ce3983;
  while (lVar2 = uVar13 + uVar21, uVar21 = uVar21 + 1, pcVar15[lVar2] == '0') {
LAB_00ce3b3e:
    if (uVar14 <= uVar21) {
      local_68.result = 0;
      uVar21 = 1;
      goto LAB_00ce3e00;
    }
  }
  goto LAB_00ce39ba;
  while( true ) {
    uVar20 = uVar21 + 1;
    bVar25 = true;
    if ((~uVar21 + uVar16 != uVar13) && (pcVar15[uVar13 + 1 + uVar21] == '_' && (byte)local_74 == 0)
       ) {
      uVar20 = uVar21 + 2;
      if ((uVar16 - uVar21) - 2 == uVar13) {
        bVar25 = false;
      }
      else {
        bVar25 = (byte)(pcVar15[uVar13 + uVar20] - 0x30U) < 10;
      }
    }
    local_68.result = local_68.result * 10 - (ulong)bVar3;
    uVar21 = uVar20;
    if (!bVar25) break;
LAB_00ce3e00:
    if (uVar14 <= uVar21) goto LAB_00ce40fe;
    bVar3 = pcVar15[uVar13 + uVar21] - 0x30;
    if (9 < bVar3) {
      if (pcVar15[uVar13 + uVar21] != '.') goto LAB_00ce442e;
      if ((byte)local_74 == 0) {
        uVar20 = uVar21 + 1;
        if (uVar14 <= uVar20) {
          iVar8 = 3;
          uVar23 = uVar20;
          goto LAB_00ce4617;
        }
        local_68.decimal = 0;
        local_70 = (ulong *)CONCAT44(local_70._4_4_,3);
        uVar24 = uVar20;
        goto LAB_00ce4160;
      }
      break;
    }
  }
  goto LAB_00ce39b8;
  while( true ) {
    if (local_68.decimal <= ~(ulong)bVar3 / 10) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar3;
    }
    uVar23 = uVar24 + 1;
    if (((~uVar24 + uVar16 != uVar13) && (pcVar15[uVar13 + 1 + uVar24] == '_')) &&
       ((uVar23 = uVar24 + 2, (uVar16 - uVar24) - 2 == uVar13 ||
        (9 < (byte)(pcVar15[uVar13 + uVar23] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar7 = 1;
      local_50 = puVar10;
      goto LAB_00ce462a;
    }
    uVar24 = uVar23;
    if (uVar14 <= uVar23) break;
LAB_00ce4160:
    bVar3 = pcVar15[uVar13 + uVar24] - 0x30;
    if (9 < bVar3) {
      local_70 = (ulong *)((ulong)local_70._4_4_ << 0x20);
      uVar23 = uVar24;
      break;
    }
  }
  local_68._18_6_ = 0;
  iVar8 = (int)local_70;
  local_50 = puVar10;
LAB_00ce4617:
  iVar7 = 1;
  if (uVar20 < uVar23) {
    iVar7 = iVar8;
  }
  if (1 < uVar21) {
    iVar7 = iVar8;
  }
LAB_00ce462a:
  uVar21 = uVar23;
  if (iVar7 == 3) {
LAB_00ce40fe:
    bVar25 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>(&local_68);
    if (bVar25) {
      bVar25 = 1 < uVar21;
      goto LAB_00ce39ba;
    }
  }
  else if (iVar7 == 0) {
LAB_00ce442e:
    bVar3 = pcVar15[uVar13 + uVar21];
    if (bVar3 - 9 < 5) {
LAB_00ce4442:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar13 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar13 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_00ce39b8;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_00ce40fe;
    }
    if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
      if ((uVar21 != 1 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar13 + uVar21 + 1;
        iVar12 = ~uVar13 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar12,&local_76,false);
        }
        else {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar12,&local_76,false);
        }
        bVar25 = false;
        if (bVar4 != false) {
          bVar25 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                             (&local_68,local_76.result);
        }
        goto LAB_00ce39ba;
      }
    }
    else if (bVar3 == 0x20) goto LAB_00ce4442;
  }
  goto LAB_00ce39b8;
  while( true ) {
    if ((long)local_68.result < 0) goto LAB_00ce39b8;
    local_68.result = uVar20 + local_68.result * 2;
    uVar21 = uVar24;
    if (uVar14 <= uVar24) break;
LAB_00ce405d:
    if (pcVar15[uVar13 + 1 + uVar21] == '0') {
      uVar20 = 0;
    }
    else {
      uVar20 = 1;
      if (pcVar15[uVar13 + 1 + uVar21] != '1') goto LAB_00ce39b8;
    }
    uVar24 = uVar21 + 1;
    if (((uVar16 - uVar21) - 2 != uVar13) && (pcVar15[uVar13 + 2 + uVar21] == '_')) {
      if (((uVar16 - uVar21) - 3 == uVar13) || ((pcVar15[uVar13 + 3 + uVar21] & 0xfeU) != 0x30))
      goto LAB_00ce39b8;
      uVar24 = uVar21 + 2;
    }
  }
LAB_00ce40db:
  bVar25 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
  bVar25 = bVar25 && 1 < uVar14;
  goto LAB_00ce39ba;
LAB_00ce3c30:
  do {
    if (~uVar13 + uVar16 <= uVar14) {
      bVar25 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
      bVar25 = 1 < uVar14 && bVar25;
      goto LAB_00ce39ba;
    }
    bVar3 = pcVar15[uVar13 + 1 + uVar14];
    bVar9 = bVar3 | 0x20;
    if (0x19 < (byte)(bVar3 + 0xbf)) {
      bVar9 = bVar3;
    }
    if ((9 < (byte)(bVar9 - 0x30)) &&
       ((0x25 < bVar9 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar9 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar9 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar13) || (pcVar15[uVar13 + 2 + uVar14] != '_')) {
LAB_00ce3ce8:
      bVar25 = local_68.result <= ~(ulong)(byte)(cVar17 + bVar9) >> 4;
      if (bVar25) {
        local_68.result = local_68.result * 0x10 + (ulong)(byte)(cVar17 + bVar9);
      }
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar13) {
        if (9 < (byte)(pcVar15[uVar13 + 3 + uVar14] - 0x30U)) {
          uVar18 = (byte)pcVar15[uVar13 + 3 + uVar14] - 0x41;
          bVar25 = false;
          if ((0x25 < uVar18) ||
             (bVar25 = false, (0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0))
          goto LAB_00ce3d0f;
        }
        goto LAB_00ce3ce8;
      }
      bVar25 = false;
    }
LAB_00ce3d0f:
    uVar14 = uVar21;
  } while (bVar25);
  goto LAB_00ce39b8;
  while( true ) {
    uVar24 = uVar21 + 1;
    bVar25 = false;
    if (local_68.result <= ~(ulong)bVar3 / 10) {
      local_68.result = local_68.result * 10 + (ulong)bVar3;
      bVar25 = true;
      if ((~uVar21 + uVar16 != uVar13) &&
         (pcVar15[uVar13 + 1 + uVar21] == '_' && (byte)local_74 == 0)) {
        uVar24 = uVar21 + 2;
        if ((uVar16 - uVar21) - 2 == uVar13) {
          bVar25 = false;
        }
        else {
          bVar25 = (byte)(pcVar15[uVar13 + uVar24] - 0x30U) < 10;
        }
      }
    }
    uVar21 = uVar24;
    if (!bVar25) break;
LAB_00ce427b:
    local_70 = (ulong *)uVar20;
    if (uVar14 <= uVar21) goto LAB_00ce4347;
    bVar3 = pcVar15[uVar13 + uVar21] - 0x30;
    if (9 < bVar3) {
      if (pcVar15[uVar13 + uVar21] != '.') goto LAB_00ce44d4;
      if ((byte)local_74 == 0) {
        uVar24 = uVar21 + 1;
        if (uVar14 <= uVar24) {
          iVar7 = 3;
          uVar19 = uVar24;
          goto LAB_00ce465c;
        }
        local_68.decimal = 0;
        iVar7 = 3;
        uVar23 = uVar24;
        goto LAB_00ce43a9;
      }
      break;
    }
  }
  goto LAB_00ce39b8;
  while( true ) {
    if (local_68.decimal <= ~(ulong)bVar3 / 10) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar3;
    }
    uVar19 = uVar23 + 1;
    if (((~uVar23 + uVar16 != uVar13) && (pcVar15[uVar13 + 1 + uVar23] == '_')) &&
       ((uVar19 = uVar23 + 2, (uVar16 - uVar23) - 2 == uVar13 ||
        (9 < (byte)(pcVar15[uVar13 + uVar19] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar8 = 1;
      local_50 = puVar10;
      goto LAB_00ce4673;
    }
    uVar23 = uVar19;
    if (uVar14 <= uVar19) break;
LAB_00ce43a9:
    bVar3 = pcVar15[uVar13 + uVar23] - 0x30;
    local_48 = uVar24;
    if (9 < bVar3) {
      iVar7 = 0;
      uVar19 = uVar23;
      break;
    }
  }
  local_68._18_6_ = 0;
  local_50 = puVar10;
LAB_00ce465c:
  iVar8 = 1;
  if (uVar24 < uVar19) {
    iVar8 = iVar7;
  }
  if (uVar20 < uVar21) {
    iVar8 = iVar7;
  }
LAB_00ce4673:
  uVar21 = uVar19;
  if (iVar8 == 3) {
LAB_00ce4347:
    bVar25 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
    if (bVar25) {
      bVar25 = uVar20 < uVar21;
      goto LAB_00ce39ba;
    }
  }
  else if (iVar8 == 0) {
LAB_00ce44d4:
    bVar3 = pcVar15[uVar13 + uVar21];
    if (bVar3 - 9 < 5) {
LAB_00ce44e4:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar13 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar13 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_00ce39b8;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_00ce4347;
    }
    if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
      if ((uVar21 != uVar20 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar13 + uVar21 + 1;
        iVar12 = ~uVar13 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar12,&local_76,false);
        }
        else {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar12,&local_76,false);
        }
        bVar25 = false;
        if (bVar4 != false) {
          bVar25 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                             (&local_68,local_76.result);
        }
        goto LAB_00ce39ba;
      }
    }
    else if (bVar3 == 0x20) goto LAB_00ce44e4;
  }
  goto LAB_00ce39b8;
  while (puVar22 = (ulong *)((long)puVar22 + 1), puVar5 = local_70, local_70 != puVar22) {
LAB_00ce4215:
    if ((0x20 < (ulong)(byte)(pcVar15 + (long)puVar22)[uVar13]) ||
       ((0x100003e00U >> ((ulong)(byte)(pcVar15 + (long)puVar22)[uVar13] & 0x3f) & 1) == 0))
    goto LAB_00ce3eb2;
  }
LAB_00ce3f99:
  bVar25 = local_50 < puVar5;
LAB_00ce3983:
  if (bVar25) {
    *puVar10 = (ulong)pcVar11;
    bVar25 = true;
  }
  else {
    if (uVar16 != 0) {
      uVar13 = 0;
      do {
        bVar3 = pcVar15[uVar13];
        if ((0x20 < (ulong)bVar3) || ((0x100003e00U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          local_68._16_8_ = 0;
          local_68.result = 0;
          local_68.decimal = 0;
          uVar14 = uVar16 - uVar13;
          local_68.decimal_digits = 0;
          local_74 = uVar6;
          input_local.value._0_8_ = this;
          if (bVar3 == 0x2d) {
            bVar25 = false;
            uVar21 = 1;
            goto LAB_00ce3b3e;
          }
          if (bVar3 == 0x30 && uVar16 - 1 != uVar13) {
            cVar17 = pcVar15[uVar13 + 1];
            if (cVar17 == 'B') {
LAB_00ce403f:
              uVar14 = ~uVar13 + uVar16;
              if (uVar14 < 2) goto LAB_00ce40db;
              local_68.result = 0;
              uVar21 = 1;
              goto LAB_00ce405d;
            }
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_00ce403f;
              if (cVar17 != 'X') {
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_00ce4258;
                break;
              }
            }
            local_68.result = 0;
            uVar14 = 1;
            goto LAB_00ce3c30;
          }
LAB_00ce4258:
          if (((byte)local_74 & bVar3 == 0x2b) == 0) {
            uVar20 = (ulong)(bVar3 == 0x2b);
            local_68.result = 0;
            uVar21 = uVar20;
            goto LAB_00ce427b;
          }
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
    }
LAB_00ce39b8:
    bVar25 = false;
LAB_00ce39ba:
    if (bVar25 != false) {
      *puVar10 = local_68.result;
    }
  }
  return bVar25;
}

Assistant:

bool TryCast::Operation(string_t input, uint64_t &result, bool strict) {
	return TrySimpleIntegerCast<uint64_t, false>(input.GetData(), input.GetSize(), result, strict);
}